

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_reading.c
# Opt level: O0

greatest_test_res fr_shapes(void)

{
  int iVar1;
  int record_count;
  shape_t *records;
  FILE *fp;
  
  records = (shape_t *)fopen("../tests/data/google_sample/shapes.txt","r");
  if ((FILE *)records == (FILE *)0x0) {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
    ;
    greatest_info.fail_line = 0x187;
    greatest_info.msg = "Couldn\'t open `data/google_sample/shapes.txt` test file";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    fp._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  else {
    iVar1 = read_all_shapes((FILE *)records,(shape_t **)&stack0xffffffffffffffe0);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0) {
      if (records != (shape_t *)0x0) {
        fclose((FILE *)records);
      }
      greatest_info.msg = (char *)0x0;
      fp._4_4_ = GREATEST_TEST_RES_PASS;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-file_reading.c"
      ;
      greatest_info.fail_line = 0x18c;
      greatest_info.msg = "0 != record_count";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      fp._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  return fp._4_4_;
}

Assistant:

TEST fr_shapes(void) {
    FILE *fp = fopen("../tests/data/google_sample/shapes.txt", "r");
    if (fp == NULL) {
        FAILm("Couldn't open `data/google_sample/shapes.txt` test file");
    } else {
        shape_t *records;
        int record_count = read_all_shapes(fp, &records);

        ASSERT_EQ(0, record_count);

        if (record_count > 0) free(records);
        if (fp) fclose(fp);
    }
    PASS();
}